

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O1

size_t readback_part(curl_mimepart *part,char *buffer,size_t bufsize)

{
  mime_state *state;
  char *__dest;
  void **ppvVar1;
  size_t *psVar2;
  mimestate mVar3;
  ulong uVar4;
  _Bool _Var5;
  size_t sVar6;
  char *pcVar7;
  curl_slist *pcVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  _Bool _Var12;
  bool bVar13;
  size_t local_70;
  size_t local_58;
  char *local_50;
  
  state = &part->state;
  __dest = (part->encstate).buf;
  ppvVar1 = &(part->state).ptr;
  sVar10 = 0;
  do {
    if (bufsize == 0) {
      return sVar10;
    }
    mVar3 = (part->state).state;
    uVar9 = 0;
    if (MIMESTATE_END < mVar3) goto switchD_0055f00b_caseD_5;
    pcVar8 = (curl_slist *)(part->state).ptr;
    switch(mVar3) {
    case MIMESTATE_BEGIN:
      pcVar8 = part->curlheaders;
      (part->state).state = ((part->flags & 2) >> 1) * 3 + MIMESTATE_CURLHEADERS;
      (part->state).ptr = pcVar8;
LAB_0055f295:
      (part->state).offset = 0;
      goto LAB_0055f2d5;
    case MIMESTATE_CURLHEADERS:
switchD_0055f00b_caseD_1:
      if (pcVar8 == (curl_slist *)0x0) {
        pcVar8 = part->userheaders;
LAB_0055f283:
        (part->state).state = MIMESTATE_USERHEADERS;
        (part->state).ptr = pcVar8;
        goto LAB_0055f295;
      }
      pcVar7 = pcVar8->data;
      sVar11 = strlen(pcVar7);
      uVar9 = readback_bytes(state,buffer,bufsize,pcVar7,sVar11,"\r\n");
      if (uVar9 == 0) {
        (part->state).ptr = pcVar8->next;
        (part->state).offset = 0;
        uVar9 = 0;
      }
      break;
    case MIMESTATE_USERHEADERS:
      if (pcVar8 != (curl_slist *)0x0) {
        pcVar7 = match_header(pcVar8,"Content-Type",0xc);
        if (pcVar7 == (char *)0x0) goto switchD_0055f00b_caseD_1;
        pcVar8 = pcVar8->next;
        goto LAB_0055f283;
      }
      state->state = MIMESTATE_EOH;
      goto LAB_0055f2d2;
    case MIMESTATE_EOH:
      uVar9 = readback_bytes(state,buffer,bufsize,"\r\n",2,"");
      if (uVar9 == 0) {
        state->state = MIMESTATE_BODY;
        *ppvVar1 = (void *)0x0;
        (part->state).offset = 0;
        uVar9 = 0;
      }
      break;
    case MIMESTATE_BODY:
      (part->encstate).pos = 0;
      (part->encstate).bufbeg = 0;
      (part->encstate).bufend = 0;
      state->state = MIMESTATE_CONTENT;
LAB_0055f2d2:
      *ppvVar1 = (void *)0x0;
      (part->state).offset = 0;
LAB_0055f2d5:
      uVar9 = 0;
      break;
    case MIMESTATE_CONTENT:
      if (part->encoder == (mime_encoder *)0x0) {
        if (part->readfunc == (curl_read_callback)0x0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (*part->readfunc)(buffer,1,bufsize,part->arg);
        }
      }
      else {
        bVar13 = false;
        _Var12 = false;
        uVar9 = 0;
        local_58 = bufsize;
        local_50 = buffer;
        do {
          while (((part->encstate).bufbeg < (part->encstate).bufend || (_Var12))) {
            sVar6 = (*part->encoder->encodefunc)(local_50,local_58,_Var12,part);
            if (sVar6 == 0) {
              if (_Var12 == false) break;
              goto LAB_0055f337;
            }
            if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) {
LAB_0055f2f8:
              if (uVar9 == 0) {
                uVar9 = sVar6;
              }
              goto LAB_0055f337;
            }
            uVar9 = uVar9 + sVar6;
            local_50 = local_50 + sVar6;
            local_58 = local_58 - sVar6;
            bVar13 = local_58 == 0;
            if (bVar13) goto LAB_0055f337;
          }
          sVar6 = (part->encstate).bufbeg;
          if (sVar6 != 0) {
            sVar11 = (part->encstate).bufend - sVar6;
            if (sVar11 != 0) {
              memmove(__dest,__dest + sVar6,sVar11);
            }
            (part->encstate).bufbeg = 0;
            (part->encstate).bufend = sVar11;
          }
          uVar4 = (part->encstate).bufend;
          if (0xff < uVar4) {
            uVar9 = uVar9 | -(ulong)(uVar9 == 0);
            break;
          }
          if (part->readfunc == (curl_read_callback)0x0) {
            sVar6 = 0;
          }
          else {
            sVar6 = (*part->readfunc)(__dest + uVar4,1,0x100 - uVar4,part->arg);
          }
          _Var5 = true;
          if (sVar6 != 0) {
            if ((sVar6 - 0x10000000 < 2) || (sVar6 == 0xffffffffffffffff)) goto LAB_0055f2f8;
            psVar2 = &(part->encstate).bufend;
            *psVar2 = *psVar2 + sVar6;
            _Var5 = _Var12;
          }
          _Var12 = _Var5;
        } while (!bVar13);
      }
LAB_0055f337:
      if ((1 < uVar9 - 0x10000000) && (uVar9 != 0xffffffffffffffff)) {
        if (uVar9 != 0) break;
        (part->state).state = MIMESTATE_END;
        *ppvVar1 = (void *)0x0;
        (part->state).offset = 0;
        if ((part->kind == MIMEKIND_FILE) && ((FILE *)part->fp != (FILE *)0x0)) {
          fclose((FILE *)part->fp);
          part->fp = (FILE *)0x0;
        }
      }
      local_70 = uVar9;
      if (sVar10 != 0) {
        local_70 = sVar10;
      }
      bVar13 = false;
      goto LAB_0055f3ac;
    case MIMESTATE_END:
      bVar13 = false;
      local_70 = sVar10;
      goto LAB_0055f3ac;
    }
switchD_0055f00b_caseD_5:
    sVar10 = sVar10 + uVar9;
    buffer = buffer + uVar9;
    bufsize = bufsize - uVar9;
    bVar13 = true;
LAB_0055f3ac:
    if (!bVar13) {
      return local_70;
    }
  } while( true );
}

Assistant:

static size_t readback_part(curl_mimepart *part,
                            char *buffer, size_t bufsize)
{
  size_t cursize = 0;
#ifdef CURL_DOES_CONVERSIONS
  char *convbuf = buffer;
#endif

  /* Readback from part. */

  while(bufsize) {
    size_t sz = 0;
    struct curl_slist *hdr = (struct curl_slist *) part->state.ptr;
    switch(part->state.state) {
    case MIMESTATE_BEGIN:
      mimesetstate(&part->state,
                   (part->flags & MIME_BODY_ONLY)?
                     MIMESTATE_BODY: MIMESTATE_CURLHEADERS,
                   part->curlheaders);
      break;
    case MIMESTATE_USERHEADERS:
      if(!hdr) {
        mimesetstate(&part->state, MIMESTATE_EOH, NULL);
        break;
      }
      if(match_header(hdr, "Content-Type", 12)) {
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, hdr->next);
        break;
      }
      /* FALLTHROUGH */
    case MIMESTATE_CURLHEADERS:
      if(!hdr)
        mimesetstate(&part->state, MIMESTATE_USERHEADERS, part->userheaders);
      else {
        sz = readback_bytes(&part->state, buffer, bufsize,
                            hdr->data, strlen(hdr->data), "\r\n");
        if(!sz)
          mimesetstate(&part->state, part->state.state, hdr->next);
      }
      break;
    case MIMESTATE_EOH:
      sz = readback_bytes(&part->state, buffer, bufsize, "\r\n", 2, "");
      if(!sz)
        mimesetstate(&part->state, MIMESTATE_BODY, NULL);
      break;
    case MIMESTATE_BODY:
#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
        convbuf = buffer;
      }
#endif
      cleanup_encoder_state(&part->encstate);
      mimesetstate(&part->state, MIMESTATE_CONTENT, NULL);
      break;
    case MIMESTATE_CONTENT:
      if(part->encoder)
        sz = read_encoded_part_content(part, buffer, bufsize);
      else
        sz = read_part_content(part, buffer, bufsize);
      switch(sz) {
      case 0:
        mimesetstate(&part->state, MIMESTATE_END, NULL);
        /* Try sparing open file descriptors. */
        if(part->kind == MIMEKIND_FILE && part->fp) {
          fclose(part->fp);
          part->fp = NULL;
        }
        /* FALLTHROUGH */
      case CURL_READFUNC_ABORT:
      case CURL_READFUNC_PAUSE:
      case READ_ERROR:
        return cursize? cursize: sz;
      }
      break;
    case MIMESTATE_END:
      return cursize;
    default:
      break;    /* Other values not in part state. */
    }

    /* Bump buffer and counters according to read size. */
    cursize += sz;
    buffer += sz;
    bufsize -= sz;
  }

#ifdef CURL_DOES_CONVERSIONS
      if(part->easy && convbuf < buffer &&
         part->state.state < MIMESTATE_BODY) {
        CURLcode result = Curl_convert_to_network(part->easy, convbuf,
                                                  buffer - convbuf);
        if(result)
          return READ_ERROR;
      }
#endif

  return cursize;
}